

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O0

Expression * wasm::fromABI(Expression *value,Type type,Module *module)

{
  BasicType BVar1;
  Unary *value_00;
  Builder local_28;
  Builder builder;
  Module *module_local;
  Expression *value_local;
  Type type_local;
  
  builder.wasm = module;
  value_local = (Expression *)type.id;
  Builder::Builder(&local_28,module);
  BVar1 = Type::getBasic((Type *)&value_local);
  module_local = (Module *)value;
  switch(BVar1) {
  case none:
    module_local = (Module *)Builder::makeDrop(&local_28,value);
    break;
  case unreachable:
    break;
  case i32:
    module_local = (Module *)Builder::makeUnary(&local_28,WrapInt64,value);
    break;
  case i64:
    break;
  case f32:
    value_00 = Builder::makeUnary(&local_28,WrapInt64,value);
    module_local = (Module *)Builder::makeUnary(&local_28,ReinterpretInt32,(Expression *)value_00);
    break;
  case f64:
    module_local = (Module *)Builder::makeUnary(&local_28,ReinterpretInt64,value);
    break;
  case v128:
    handle_unreachable("v128 not implemented yet",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/FuncCastEmulation.cpp"
                       ,0x65);
  }
  return (Expression *)module_local;
}

Assistant:

static Expression* fromABI(Expression* value, Type type, Module* module) {
  Builder builder(*module);
  switch (type.getBasic()) {
    case Type::i32: {
      value = builder.makeUnary(WrapInt64, value);
      break;
    }
    case Type::i64: {
      // already good
      break;
    }
    case Type::f32: {
      value = builder.makeUnary(ReinterpretInt32,
                                builder.makeUnary(WrapInt64, value));
      break;
    }
    case Type::f64: {
      value = builder.makeUnary(ReinterpretInt64, value);
      break;
    }
    case Type::v128: {
      WASM_UNREACHABLE("v128 not implemented yet");
    }
    case Type::none: {
      value = builder.makeDrop(value);
      break;
    }
    case Type::unreachable: {
      // can leave it, the call isn't taken anyhow
      break;
    }
  }
  return value;
}